

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_popup_end(nk_context *ctx)

{
  nk_window *pnVar1;
  nk_window *win_00;
  nk_buffer *pnVar2;
  nk_handle nVar3;
  nk_size nVar4;
  nk_size nVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  nk_rect r;
  nk_panel *local_28;
  nk_panel *root;
  nk_window *popup;
  nk_window *win;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x41eb,"void nk_popup_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x41ec,"void nk_popup_end(struct nk_context *)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x41ed,"void nk_popup_end(struct nk_context *)");
  }
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
      (ctx->current->layout != (nk_panel *)0x0)) &&
     (pnVar1 = ctx->current, pnVar1->parent != (nk_window *)0x0)) {
    win_00 = pnVar1->parent;
    if ((pnVar1->flags & 0x2000) != 0) {
      for (local_28 = win_00->layout; local_28 != (nk_panel *)0x0; local_28 = local_28->parent) {
        local_28->flags = local_28->flags | 0x10000;
      }
      (win_00->popup).active = 0;
    }
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar1->buffer,r);
    nk_end(ctx);
    pnVar2 = (pnVar1->buffer).base;
    fVar10 = (pnVar1->buffer).clip.x;
    fVar11 = (pnVar1->buffer).clip.y;
    fVar6 = (pnVar1->buffer).clip.w;
    fVar7 = (pnVar1->buffer).clip.h;
    iVar8 = (pnVar1->buffer).use_clipping;
    uVar9 = *(undefined4 *)&(pnVar1->buffer).field_0x1c;
    nVar3 = (pnVar1->buffer).userdata;
    nVar4 = (pnVar1->buffer).begin;
    nVar5 = (pnVar1->buffer).last;
    (win_00->buffer).end = (pnVar1->buffer).end;
    (win_00->buffer).last = nVar5;
    (win_00->buffer).userdata = nVar3;
    (win_00->buffer).begin = nVar4;
    (win_00->buffer).clip.w = fVar6;
    (win_00->buffer).clip.h = fVar7;
    (win_00->buffer).use_clipping = iVar8;
    *(undefined4 *)&(win_00->buffer).field_0x1c = uVar9;
    (win_00->buffer).base = pnVar2;
    (win_00->buffer).clip.x = fVar10;
    (win_00->buffer).clip.y = fVar11;
    nk_finish_popup(ctx,win_00);
    ctx->current = win_00;
    nk_push_scissor(&win_00->buffer,win_00->layout->clip);
  }
  return;
}

Assistant:

NK_API void
nk_popup_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_window *popup;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    popup = ctx->current;
    if (!popup->parent) return;
    win = popup->parent;
    if (popup->flags & NK_WINDOW_HIDDEN) {
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 0;
    }
    nk_push_scissor(&popup->buffer, nk_null_rect);
    nk_end(ctx);

    win->buffer = popup->buffer;
    nk_finish_popup(ctx, win);
    ctx->current = win;
    nk_push_scissor(&win->buffer, win->layout->clip);
}